

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall JSON::Parser::unexpected(Parser *this,int current)

{
  pointer pcVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  Position PVar4;
  long *plVar5;
  ostream *poVar6;
  uint uVar7;
  size_type *psVar8;
  long *plVar9;
  ulong uVar10;
  uint __len;
  string __str;
  string msg;
  string source;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  checkEndOfUnexpected(this,current);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (this->input)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (this->input)._M_string_length);
  getStringAt(&local_50,&local_70,this->pos);
  PVar4 = getPosition(&local_70,current);
  std::operator+(&local_f0,"Uncaught SyntaxError: Unexpected token ",&local_50);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_1b0._M_dataplus._M_p = (pointer)*plVar5;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_1b0._M_dataplus._M_p == psVar8) {
    local_1b0.field_2._M_allocated_capacity = *psVar8;
    local_1b0.field_2._8_8_ = plVar5[3];
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar8;
  }
  local_1b0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar3 = getStringIndexAt(&local_70,current);
  __val = -uVar3;
  if (0 < (int)uVar3) {
    __val = uVar3;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00106be4;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00106be4;
      }
      if (uVar7 < 10000) goto LAB_00106be4;
      uVar10 = uVar10 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_00106be4:
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1d0,(char)__len - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1d0._M_dataplus._M_p + (uVar3 >> 0x1f),__len,__val);
  std::operator+(&local_d0,&local_1b0,&local_1d0);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_190._M_dataplus._M_p = (pointer)*plVar5;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_190._M_dataplus._M_p == psVar8) {
    local_190.field_2._M_allocated_capacity = *psVar8;
    local_190.field_2._8_8_ = plVar5[3];
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  }
  else {
    local_190.field_2._M_allocated_capacity = *psVar8;
  }
  local_190._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::to_string(&local_110,PVar4.line);
  std::operator+(&local_b0,&local_190,&local_110);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_170._M_dataplus._M_p = (pointer)*plVar5;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_170._M_dataplus._M_p == psVar8) {
    local_170.field_2._M_allocated_capacity = *psVar8;
    local_170.field_2._8_8_ = plVar5[3];
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar8;
  }
  local_170._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::to_string(&local_130,PVar4.column);
  std::operator+(&local_90,&local_170,&local_130);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_150 = (long *)*plVar5;
  plVar9 = plVar5 + 2;
  if (local_150 == plVar9) {
    local_140 = *plVar9;
    lStack_138 = plVar5[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *plVar9;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_150,local_148);
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(1);
}

Assistant:

void Parser::unexpected(int current) {
        checkEndOfUnexpected(current);

        string source = input;
        string str = getStringAt(source, pos);
        Position position = getPosition(source, current);
        string msg = "Uncaught SyntaxError: Unexpected token "
                     + str + " in JSON at position " + to_string(getStringIndexAt(source, current))
                     + " (line " + to_string(position.line) + ", column " + to_string(position.column) + ")";
        cerr << msg << endl;
        exit(1);
    }